

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::UniformCase::writeUniformDefinitions(UniformCase *this,ostringstream *dst)

{
  pointer ppSVar1;
  pointer pUVar2;
  bool bVar3;
  DataType DVar4;
  ostream *poVar5;
  UniformCollection *pUVar6;
  int i;
  long lVar7;
  int i_1;
  int i_2;
  long lVar8;
  allocator<char> local_a9;
  UniformCase *local_a8;
  ostream *local_a0;
  vector<glu::DataType,_std::allocator<glu::DataType>_> samplerTypes;
  string local_50;
  
  lVar7 = 0;
  local_a8 = this;
  local_a0 = (ostream *)dst;
  while( true ) {
    pUVar6 = (local_a8->m_uniformCollection).m_ptr;
    ppSVar1 = (pUVar6->m_structTypes).
              super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pUVar6->m_structTypes).
                            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1) >> 3) <=
        lVar7) break;
    samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppSVar1[lVar7];
    samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)samplerTypes.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffff00000000);
    poVar5 = glu::decl::operator<<(local_a0,(DeclareStructTypePtr *)&samplerTypes);
    std::operator<<(poVar5,";\n");
    lVar7 = lVar7 + 1;
  }
  lVar7 = 0x20;
  for (lVar8 = 0;
      lVar8 < (int)(((long)(pUVar6->m_uniforms).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pUVar6->m_uniforms).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x38); lVar8 = lVar8 + 1) {
    poVar5 = std::operator<<(local_a0,"uniform ");
    pUVar2 = (((local_a8->m_uniformCollection).m_ptr)->m_uniforms).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)((long)pUVar2 + lVar7 + -0x20),&local_a9);
    glu::decl::DeclareVariable::DeclareVariable
              ((DeclareVariable *)&samplerTypes,(VarType *)((long)&pUVar2->name + lVar7),&local_50,0
              );
    poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&samplerTypes);
    std::operator<<(poVar5,";\n");
    glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&samplerTypes);
    std::__cxx11::string::~string((string *)&local_50);
    pUVar6 = (local_a8->m_uniformCollection).m_ptr;
    lVar7 = lVar7 + 0x38;
  }
  std::operator<<(local_a0,"\n");
  pUVar6 = (local_a8->m_uniformCollection).m_ptr;
  samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar7 = 0x20;
  lVar8 = 0;
  while( true ) {
    pUVar2 = (pUVar6->m_uniforms).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(pUVar6->m_uniforms).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x38) <= lVar8)
    break;
    getDistinctSamplerTypes(&samplerTypes,(VarType *)((long)&pUVar2->name + lVar7));
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + 0x38;
  }
  lVar7 = 0;
  do {
    if (lVar7 == 0x19) {
      std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
                (&samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>);
      return;
    }
    for (lVar8 = 0;
        lVar8 < (int)((ulong)((long)samplerTypes.
                                    super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)samplerTypes.
                                   super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 2);
        lVar8 = lVar8 + 1) {
      if (samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8] - TYPE_SAMPLER_1D < 0x1e) {
        DVar4 = getSamplerLookupReturnType
                          (samplerTypes.
                           super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar8]);
        bVar3 = (*writeUniformDefinitions::compareFuncs[lVar7].requiringTypes[0])(DVar4);
        if (bVar3) goto LAB_004ecb1b;
        bVar3 = (*writeUniformDefinitions::compareFuncs[lVar7].requiringTypes[1])(DVar4);
        if (bVar3) goto LAB_004ecb1b;
      }
    }
    bVar3 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                      ((local_a8->m_uniformCollection).m_ptr,
                       writeUniformDefinitions::compareFuncs[lVar7].requiringTypes[0]);
    if (bVar3) {
LAB_004ecb1b:
      poVar5 = std::operator<<(local_a0,writeUniformDefinitions::compareFuncs[lVar7].definition);
      std::operator<<(poVar5,"\n");
    }
    else {
      bVar3 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                        ((local_a8->m_uniformCollection).m_ptr,
                         writeUniformDefinitions::compareFuncs[lVar7].requiringTypes[1]);
      if (bVar3) goto LAB_004ecb1b;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void UniformCase::writeUniformDefinitions (std::ostringstream& dst) const
{
	for (int i = 0; i < (int)m_uniformCollection->getNumStructTypes(); i++)
		dst << glu::declare(m_uniformCollection->getStructType(i)) << ";\n";

	for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
		dst << "uniform " << glu::declare(m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str()) << ";\n";

	dst << "\n";

	{
		static const struct
		{
			dataTypePredicate	requiringTypes[2];
			const char*			definition;
		} compareFuncs[] =
		{
			{ { glu::isDataTypeFloatOrVec,				glu::isDataTypeMatrix				}, "mediump float compare_float    (mediump float a, mediump float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }"																		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC2>,	dataTypeIsMatrixWithNRows<2>		}, "mediump float compare_vec2     (mediump vec2 a, mediump vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }"														},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC3>,	dataTypeIsMatrixWithNRows<3>		}, "mediump float compare_vec3     (mediump vec3 a, mediump vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }"								},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC4>,	dataTypeIsMatrixWithNRows<4>		}, "mediump float compare_vec4     (mediump vec4 a, mediump vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }"		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2     (mediump mat2 a, mediump mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2X3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2x3   (mediump mat2x3 a, mediump mat2x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2X4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2x4   (mediump mat2x4 a, mediump mat2x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3X2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3x2   (mediump mat3x2 a, mediump mat3x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3     (mediump mat3 a, mediump mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3X4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3x4   (mediump mat3x4 a, mediump mat3x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4X2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4x2   (mediump mat4x2 a, mediump mat4x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2])*compare_vec2(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4X3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4x3   (mediump mat4x3 a, mediump mat4x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2])*compare_vec3(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4     (mediump mat4 a, mediump mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_INT>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_int      (mediump int a, mediump int b)      { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC2>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec2    (mediump ivec2 a, mediump ivec2 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC3>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec3    (mediump ivec3 a, mediump ivec3 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC4>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec4    (mediump ivec4 a, mediump ivec4 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uint     (mediump uint a, mediump uint b)    { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT_VEC2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uvec2    (mediump uvec2 a, mediump uvec2 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT_VEC3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uvec3    (mediump uvec3 a, mediump uvec3 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT_VEC4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uvec4    (mediump uvec4 a, mediump uvec4 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bool     (bool a, bool b)                    { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec2    (bvec2 a, bvec2 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec3    (bvec3 a, bvec3 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec4    (bvec4 a, bvec4 b)                  { return a == b ? 1.0 : 0.0; }"																					}
		};

		const vector<glu::DataType> samplerTypes = m_uniformCollection->getSamplerTypes();

		for (int compFuncNdx = 0; compFuncNdx < DE_LENGTH_OF_ARRAY(compareFuncs); compFuncNdx++)
		{
			const dataTypePredicate		(&typeReq)[2]			= compareFuncs[compFuncNdx].requiringTypes;
			bool						containsTypeSampler		= false;

			for (int i = 0; i < (int)samplerTypes.size(); i++)
			{
				if (glu::isDataTypeSampler(samplerTypes[i]))
				{
					const glu::DataType retType = getSamplerLookupReturnType(samplerTypes[i]);
					if (typeReq[0](retType) || typeReq[1](retType))
					{
						containsTypeSampler = true;
						break;
					}
				}
			}

			if (containsTypeSampler || m_uniformCollection->containsMatchingBasicType(typeReq[0]) || m_uniformCollection->containsMatchingBasicType(typeReq[1]))
				dst << compareFuncs[compFuncNdx].definition << "\n";
		}
	}
}